

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_0::HangingHttpService::request
          (HangingHttpService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *responseSender)

{
  PromiseArena *pPVar1;
  OwnPromiseNode node;
  void *pvVar2;
  undefined4 in_register_00000034;
  PromiseArena *pPVar3;
  AttachmentPromiseNodeBase *this_00;
  Promise<void> result;
  OwnPromiseNode local_38;
  PromiseArenaMember *local_30;
  
  pPVar3 = (PromiseArena *)CONCAT44(in_register_00000034,method);
  kj::_::neverDone();
  local_38.ptr = (PromiseNode *)local_30;
  *(int *)(pPVar3->bytes + 8) = *(int *)(pPVar3->bytes + 8) + 1;
  pPVar1 = local_30->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_30 - (long)pPVar1) < 0x28) {
    pvVar2 = operator_new(0x400);
    this_00 = (AttachmentPromiseNodeBase *)((long)pvVar2 + 0x3d8);
    kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(this_00,&local_38);
    *(undefined ***)((long)pvVar2 + 0x3d8) = &PTR_destroy_00639e98;
    *(undefined1 *)((long)pvVar2 + 0x3f0) = 1;
    *(PromiseArena **)((long)pvVar2 + 0x3f8) = pPVar3;
    *(void **)((long)pvVar2 + 0x3e0) = pvVar2;
  }
  else {
    local_30->arena = (PromiseArena *)0x0;
    this_00 = (AttachmentPromiseNodeBase *)&local_30[-3].arena;
    kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(this_00,&local_38);
    local_30[-3].arena = (PromiseArena *)&PTR_destroy_00639e98;
    *(undefined1 *)&local_30[-1]._vptr_PromiseArenaMember = 1;
    local_30[-1].arena = pPVar3;
    local_30[-2]._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  node.ptr = local_38.ptr;
  (this->super_HttpService)._vptr_HttpService = (_func_int **)this_00;
  if (&(local_38.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_38.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& responseSender) override {
    kj::Promise<void> result = kj::NEVER_DONE;
    ++inFlight;
    return result.attach(kj::defer([this]() {
      if (--inFlight == 0) {
        KJ_IF_SOME(f, onCancelFulfiller) {
          f->fulfill();
        }
      }
    }));
  }